

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
opt<char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [18],desc *Ms_1,
          OptionHidden *Ms_2,initializer<bool> *Ms_3,cat *Ms_4,sub *Ms_5)

{
  cat *Ms_local_4;
  initializer<bool> *Ms_local_3;
  OptionHidden *Ms_local_2;
  desc *Ms_local_1;
  char (*Ms_local) [18];
  opt<bool,_false,_llvm::cl::parser<bool>_> *this_local;
  
  Option::Option((Option *)this,Optional,NotHidden);
  opt_storage<bool,_false,_false>::opt_storage((opt_storage<bool,_false,_false> *)(this + 0x98));
  *(undefined ***)this = &PTR_handleOccurrence_00438a40;
  parser<bool>::parser((parser<bool> *)(this + 0xb0),(Option *)this);
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this,Ms,Ms_1,Ms_2,Ms_3,Ms_4,Ms_5);
  opt<bool,_false,_llvm::cl::parser<bool>_>::done((opt<bool,_false,_llvm::cl::parser<bool>_> *)this)
  ;
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }